

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point_attribute.cc
# Opt level: O0

ValueType __thiscall
draco::PointAttribute::DeduplicateFormattedValues<unsigned_short,2>
          (PointAttribute *this,GeometryAttribute *in_att,AttributeValueIndex in_att_offset)

{
  bool bVar1;
  uint uVar2;
  reference pvVar3;
  reference pvVar4;
  pointer ppVar5;
  reference pvVar6;
  size_t sVar7;
  PointAttribute *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<array<unsigned_short,_2UL>,_IndexType<unsigned_int,_AttributeValueIndex_tag_type_>_>_&&>::value,_pair<iterator,_bool>_>
  _Var8;
  PointIndex i_2;
  uint32_t i_1;
  bool inserted;
  iterator it;
  AttributeValueIndex att_pos;
  AttributeValueIndex i;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  value_map;
  AttributeHashableValue hashable_value;
  AttributeValue att_value;
  ValueToIndexMap value_to_index_map;
  AttributeValueIndex unique_vals;
  PointAttribute *in_stack_fffffffffffffe98;
  PointAttribute *in_stack_fffffffffffffea0;
  pair<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>,_bool>
  *in_stack_fffffffffffffea8;
  unordered_map<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::equal_to<std::array<unsigned_short,_2UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  *in_stack_fffffffffffffeb0;
  reference in_stack_fffffffffffffec0;
  undefined7 in_stack_fffffffffffffec8;
  undefined1 in_stack_fffffffffffffecf;
  AttributeValueIndex att_index;
  _Node_iterator_base<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  in_stack_fffffffffffffed0;
  uint local_100;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_fc;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_f8;
  uint local_f4;
  IndexType<unsigned_int,_draco::PointIndex_tag_type_> local_f0;
  uint local_ec;
  undefined4 local_e8;
  uint local_e4;
  _Node_iterator_base<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_d0;
  undefined1 local_c8;
  pair<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  local_c0;
  _Node_iterator_base<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
  local_b8;
  undefined1 local_b0;
  byte local_a1;
  uint local_94;
  _Type local_90;
  uint local_8c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_88 [10];
  array<unsigned_short,_2UL> local_60;
  _Type local_5c;
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> local_1c [6];
  uint local_4;
  
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_1c,0);
  std::
  unordered_map<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::equal_to<std::array<unsigned_short,_2UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::unordered_map((unordered_map<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::equal_to<std::array<unsigned_short,_2UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                   *)0x1b5507);
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                     *)in_stack_fffffffffffffed0._M_cur,
                    CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8));
  IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(local_88,0);
  while( true ) {
    att_index.value_ = (uint)in_stack_fffffffffffffed0._M_cur;
    bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator<
                      (local_88,&in_RDI->num_unique_entries_);
    if (!bVar1) break;
    local_94 = (uint)IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator+
                               ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                in_stack_fffffffffffffe98,
                                (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                                0x1b5567);
    local_8c = local_94;
    local_90 = (_Type)GeometryAttribute::GetValue<unsigned_short,2>
                                ((GeometryAttribute *)
                                 CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                                 att_index);
    local_5c = local_90;
    pvVar3 = std::array<unsigned_short,_2UL>::operator[]
                       ((array<unsigned_short,_2UL> *)in_stack_fffffffffffffea0,
                        (size_type)in_stack_fffffffffffffe98);
    pvVar4 = std::array<unsigned_short,_2UL>::operator[]
                       ((array<unsigned_short,_2UL> *)in_stack_fffffffffffffea0,
                        (size_type)in_stack_fffffffffffffe98);
    *(undefined4 *)pvVar3 = *(undefined4 *)pvVar4;
    std::__detail::
    _Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
    ::_Node_iterator((_Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                      *)0x1b55ff);
    std::
    pair<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
    ::
    pair<std::array<unsigned_short,_2UL>_&,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_&,_true>
              (&local_c0,&local_60,local_1c);
    _Var8 = std::
            unordered_map<std::array<unsigned_short,2ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>,draco::HashArray<std::array<unsigned_short,2ul>>,std::equal_to<std::array<unsigned_short,2ul>>,std::allocator<std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>>
            ::
            insert<std::pair<std::array<unsigned_short,2ul>,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>>
                      (in_stack_fffffffffffffeb0,
                       (pair<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                        *)in_stack_fffffffffffffea8);
    in_stack_fffffffffffffed0._M_cur =
         (__node_type *)
         _Var8.first.
         super__Node_iterator_base<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_true>
         ._M_cur;
    in_stack_fffffffffffffecf = _Var8.second;
    local_d0._M_cur = in_stack_fffffffffffffed0._M_cur;
    local_c8 = in_stack_fffffffffffffecf;
    local_b8._M_cur = in_stack_fffffffffffffed0._M_cur;
    local_b0 = in_stack_fffffffffffffecf;
    std::
    tie<std::__detail::_Node_iterator<std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,false,true>,bool>
              (&in_stack_fffffffffffffea8->first,(bool *)in_stack_fffffffffffffea0);
    std::
    tuple<std::__detail::_Node_iterator<std::pair<std::array<unsigned_short,2ul>const,draco::IndexType<unsigned_int,draco::AttributeValueIndex_tag_type_>>,false,true>&,bool&>
    ::operator=((tuple<std::__detail::_Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>_&,_bool_&>
                 *)in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    if ((local_a1 & 1) == 0) {
      ppVar5 = std::__detail::
               _Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
               ::operator->((_Node_iterator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>,_false,_true>
                             *)0x1b56c3);
      in_stack_fffffffffffffec0 =
           IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
           ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                         *)in_stack_fffffffffffffea0,
                        (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                        in_stack_fffffffffffffe98);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                (in_stack_fffffffffffffec0,&ppVar5->second);
    }
    else {
      local_e4 = local_1c[0].value_;
      GeometryAttribute::SetAttributeValue
                ((GeometryAttribute *)CONCAT17(in_stack_fffffffffffffecf,in_stack_fffffffffffffec8),
                 (AttributeValueIndex)(uint)((ulong)in_stack_fffffffffffffed0._M_cur >> 0x20),
                 in_stack_fffffffffffffec0);
      in_stack_fffffffffffffeb0 =
           (unordered_map<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::equal_to<std::array<unsigned_short,_2UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
            *)IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
              ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                            *)in_stack_fffffffffffffea0,
                           (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                           in_stack_fffffffffffffe98);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator=
                ((IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                 in_stack_fffffffffffffeb0,local_1c);
      IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_1c);
    }
    IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator++(local_88);
  }
  bVar1 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::operator==
                    (local_1c,&in_RDI->num_unique_entries_);
  if (bVar1) {
    local_4 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
  }
  else {
    bVar1 = is_mapping_identity(in_RDI);
    if (bVar1) {
      SetExplicitMapping(in_stack_fffffffffffffea0,(size_t)in_stack_fffffffffffffe98);
      for (local_ec = 0; local_ec < in_RDI->num_unique_entries_; local_ec = local_ec + 1) {
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_f0,local_ec);
        IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::IndexType(&local_f8,local_ec)
        ;
        pvVar6 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                 ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                               *)in_stack_fffffffffffffea0,
                              (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                              in_stack_fffffffffffffe98);
        local_f4 = pvVar6->value_;
        SetPointMapEntry(in_stack_fffffffffffffe98,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffea0);
      }
    }
    else {
      IndexType<unsigned_int,_draco::PointIndex_tag_type_>::IndexType(&local_fc,0);
      while( true ) {
        sVar7 = IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                ::size((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                        *)0x1b58b7);
        local_100 = (uint)sVar7;
        bVar1 = IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator<
                          (&local_fc,&local_100);
        if (!bVar1) break;
        in_stack_fffffffffffffea0 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffea0,
                          (IndexType<unsigned_int,_draco::PointIndex_tag_type_> *)
                          in_stack_fffffffffffffe98);
        in_stack_fffffffffffffe98 =
             (PointAttribute *)
             IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
             ::operator[]((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                           *)in_stack_fffffffffffffea0,
                          (IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_> *)
                          in_stack_fffffffffffffe98);
        SetPointMapEntry(in_stack_fffffffffffffe98,
                         (PointIndex)(uint)((ulong)in_stack_fffffffffffffea0 >> 0x20),
                         (AttributeValueIndex)(uint)in_stack_fffffffffffffea0);
        IndexType<unsigned_int,_draco::PointIndex_tag_type_>::operator++(&local_fc);
      }
    }
    uVar2 = IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>::value(local_1c);
    in_RDI->num_unique_entries_ = uVar2;
    local_4 = in_RDI->num_unique_entries_;
  }
  local_e8 = 1;
  IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
  ::~IndexTypeVector((IndexTypeVector<draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>
                      *)0x1b5974);
  std::
  unordered_map<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::equal_to<std::array<unsigned_short,_2UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
  ::~unordered_map((unordered_map<std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>,_draco::HashArray<std::array<unsigned_short,_2UL>_>,_std::equal_to<std::array<unsigned_short,_2UL>_>,_std::allocator<std::pair<const_std::array<unsigned_short,_2UL>,_draco::IndexType<unsigned_int,_draco::AttributeValueIndex_tag_type_>_>_>_>
                    *)0x1b5981);
  return local_4;
}

Assistant:

AttributeValueIndex::ValueType PointAttribute::DeduplicateFormattedValues(
    const GeometryAttribute &in_att, AttributeValueIndex in_att_offset) {
  // We want to detect duplicates using a hash map but we cannot hash floating
  // point numbers directly so bit-copy floats to the same sized integers and
  // hash them.

  // First we need to determine which int type to use (1, 2, 4 or 8 bytes).
  // Note, this is done at compile time using std::conditional struct.
  // Conditional is in form <bool-expression, true, false>. If bool-expression
  // is true the "true" branch is used and vice versa. All at compile time.
  typedef conditional_t<sizeof(T) == 1, uint8_t,
                        conditional_t<sizeof(T) == 2, uint16_t,
                                      conditional_t<sizeof(T) == 4, uint32_t,
                                                    /*else*/ uint64_t>>>
      HashType;

  AttributeValueIndex unique_vals(0);
  typedef std::array<T, num_components_t> AttributeValue;
  typedef std::array<HashType, num_components_t> AttributeHashableValue;
  typedef unordered_map<AttributeHashableValue, AttributeValueIndex,
                        HashArray<AttributeHashableValue>>
      ValueToIndexMap;

  // Hash map storing index of the first attribute with a given value.
  ValueToIndexMap value_to_index_map;
  AttributeValue att_value;
  AttributeHashableValue hashable_value;
  IndexTypeVector<AttributeValueIndex, AttributeValueIndex> value_map(
      num_unique_entries_);
  for (AttributeValueIndex i(0); i < num_unique_entries_; ++i) {
    const AttributeValueIndex att_pos = i + in_att_offset;
    att_value = in_att.GetValue<T, num_components_t>(att_pos);
    // Convert the value to hashable type. Bit-copy real attributes to integers.
    memcpy(&(hashable_value[0]), &(att_value[0]), sizeof(att_value));

    typename ValueToIndexMap::iterator it;
    bool inserted;
    std::tie(it, inserted) = value_to_index_map.insert(
        std::pair<AttributeHashableValue, AttributeValueIndex>(hashable_value,
                                                               unique_vals));

    // Try to update the hash map with a new entry pointing to the latest unique
    // vertex index.
    if (!inserted) {
      // Duplicated value found. Update index mapping.
      value_map[i] = it->second;
    } else {
      // New unique value.
      SetAttributeValue(unique_vals, &att_value);
      // Update index mapping.
      value_map[i] = unique_vals;

      ++unique_vals;
    }
  }
  if (unique_vals == num_unique_entries_) {
    return unique_vals.value();  // Nothing has changed.
  }
  if (is_mapping_identity()) {
    // Change identity mapping to the explicit one.
    // The number of points is equal to the number of old unique values.
    SetExplicitMapping(num_unique_entries_);
    // Update the explicit map.
    for (uint32_t i = 0; i < num_unique_entries_; ++i) {
      SetPointMapEntry(PointIndex(i), value_map[AttributeValueIndex(i)]);
    }
  } else {
    // Update point to value map using the mapping between old and new values.
    for (PointIndex i(0); i < static_cast<uint32_t>(indices_map_.size()); ++i) {
      SetPointMapEntry(i, value_map[indices_map_[i]]);
    }
  }
  num_unique_entries_ = unique_vals.value();
  return num_unique_entries_;
}